

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  cmGlobalGenerator *this_00;
  cmMakefile *this_01;
  string *psVar6;
  cmTarget *this_02;
  cmGeneratorTarget *this_03;
  cmLocalGenerator *pcVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  bool in_DL;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 collapse;
  bool collapse_00;
  bool collapse_01;
  char *__format;
  cmOutputConverter *outputConverter;
  string *lib;
  pointer lib_00;
  cmLinkLineComputer linkLineComputer;
  bool system;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  string libs;
  string buildType;
  string linkLibs;
  string mode;
  string language;
  string packageName;
  string linkPath;
  string frameworkPath;
  undefined1 local_108 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  string linkFlags;
  string flags;
  string systemFile;
  cmStateSnapshot snapshot;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&linkLineComputer,(SystemTools *)0x1,in_DL);
  SetHomeDirectory(this,(string *)&linkLineComputer);
  collapse = extraout_DL;
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
    collapse = extraout_DL_00;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&linkLineComputer,(SystemTools *)0x1,(bool)collapse);
  SetHomeOutputDirectory(this,(string *)&linkLineComputer);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  this_00 = (cmGlobalGenerator *)operator_new(0x608);
  cmGlobalGenerator::cmGlobalGenerator(this_00,this);
  SetGlobalGenerator(this,this_00);
  snapshot.Position.Position = (this->CurrentSnapshot).Position.Position;
  snapshot.State = (this->CurrentSnapshot).State;
  snapshot.Position.Tree = (this->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&linkLineComputer,&snapshot);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&system,(SystemTools *)0x1,collapse_00);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&linkLineComputer,(string *)&system);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_system != &local_220) {
    operator_delete(_system,local_220._M_allocated_capacity + 1);
  }
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&linkLineComputer,&snapshot);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&system,(SystemTools *)0x1,collapse_01);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&linkLineComputer,(string *)&system);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_system != &local_220) {
    operator_delete(_system,local_220._M_allocated_capacity + 1);
  }
  cmStateSnapshot::SetDefaultDefinitions(&snapshot);
  this_01 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(this_01,this_00,&snapshot);
  cmGlobalGenerator::AddMakefile(this_00,this_01);
  cmMakefile::SetArgcArgv(this_01,args);
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&linkLineComputer,"CMakeFindPackageMode.cmake","");
  cmMakefile::GetModulesFile(&systemFile,this_01,(string *)&linkLineComputer,&system);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  cmMakefile::ReadListFile(this_01,&systemFile);
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"LANGUAGE","");
  psVar6 = cmMakefile::GetSafeDefinition(this_01,(string *)&linkLineComputer);
  language._M_dataplus._M_p = (pointer)&language.field_2;
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&language,pcVar1,pcVar1 + psVar6->_M_string_length);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"MODE","");
  psVar6 = cmMakefile::GetSafeDefinition(this_01,(string *)&linkLineComputer);
  mode._M_dataplus._M_p = (pointer)&mode.field_2;
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&mode,pcVar1,pcVar1 + psVar6->_M_string_length);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"NAME","");
  psVar6 = cmMakefile::GetSafeDefinition(this_01,(string *)&linkLineComputer);
  packageName._M_dataplus._M_p = (pointer)&packageName.field_2;
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&packageName,pcVar1,pcVar1 + psVar6->_M_string_length);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"PACKAGE_FOUND","");
  bVar3 = cmMakefile::IsOn(this_01,(string *)&linkLineComputer);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"PACKAGE_QUIET","");
  bVar4 = cmMakefile::IsOn(this_01,(string *)&linkLineComputer);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  if (bVar3) {
    iVar5 = std::__cxx11::string::compare((char *)&mode);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)&mode);
      if (iVar5 == 0) {
        _system = (pointer)&local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)&system,"PACKAGE_INCLUDE_DIRS","")
        ;
        psVar6 = cmMakefile::GetSafeDefinition(this_01,(string *)&system);
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        pcVar1 = (psVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&linkLineComputer,pcVar1,pcVar1 + psVar6->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_system != &local_220) {
          operator_delete(_system,local_220._M_allocated_capacity + 1);
        }
        linkLibs._M_dataplus._M_p = (pointer)0x0;
        linkLibs._M_string_length = 0;
        linkLibs.field_2._M_allocated_capacity = 0;
        cmSystemTools::ExpandListArgument
                  ((string *)&linkLineComputer,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&linkLibs,false);
        cmGlobalGenerator::CreateGenerationObjects(this_00,AllTargets);
        pcVar7 = *(this_00->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        paVar9 = &libs.field_2;
        libs._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&libs,"");
        cmLocalGenerator::GetIncludeFlags
                  ((string *)&system,pcVar7,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&linkLibs,(cmGeneratorTarget *)0x0,&language,false,false,&libs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libs._M_dataplus._M_p != paVar9) {
          operator_delete(libs._M_dataplus._M_p,libs.field_2._M_allocated_capacity + 1);
        }
        buildType._M_dataplus._M_p = (pointer)&buildType.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&buildType,"PACKAGE_DEFINITIONS","");
        psVar6 = cmMakefile::GetSafeDefinition(this_01,&buildType);
        pcVar1 = (psVar6->_M_dataplus)._M_p;
        libs._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&libs,pcVar1,pcVar1 + psVar6->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)buildType._M_dataplus._M_p != &buildType.field_2) {
          operator_delete(buildType._M_dataplus._M_p,buildType.field_2._M_allocated_capacity + 1);
        }
        printf("%s %s\n",_system,libs._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libs._M_dataplus._M_p != paVar9) {
          operator_delete(libs._M_dataplus._M_p,libs.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_system != &local_220) {
          operator_delete(_system,local_220._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&linkLibs);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&mode);
        if (iVar5 == 0) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          linkLineComputer._vptr_cmLinkLineComputer =
               (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
          std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"dummy","");
          this_02 = cmMakefile::AddExecutable(this_01,(string *)&linkLineComputer,&srcs,true);
          if (linkLineComputer._vptr_cmLinkLineComputer !=
              (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
            operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                            linkLineComputer.StateDir.DirectoryState.Position + 1);
          }
          linkLineComputer._vptr_cmLinkLineComputer =
               (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&linkLineComputer,"LINKER_LANGUAGE","");
          cmTarget::SetProperty(this_02,(string *)&linkLineComputer,language._M_dataplus._M_p);
          if (linkLineComputer._vptr_cmLinkLineComputer !=
              (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
            operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                            linkLineComputer.StateDir.DirectoryState.Position + 1);
          }
          linkLineComputer._vptr_cmLinkLineComputer =
               (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&linkLineComputer,"PACKAGE_LIBRARIES","");
          psVar6 = cmMakefile::GetSafeDefinition(this_01,(string *)&linkLineComputer);
          libs._M_dataplus._M_p = (pointer)&libs.field_2;
          pcVar1 = (psVar6->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&libs,pcVar1,pcVar1 + psVar6->_M_string_length);
          if (linkLineComputer._vptr_cmLinkLineComputer !=
              (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
            operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                            linkLineComputer.StateDir.DirectoryState.Position + 1);
          }
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument(&libs,&libList,false);
          pbVar2 = libList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (lib_00 = libList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; lib_00 != pbVar2;
              lib_00 = lib_00 + 1) {
            cmTarget::AddLinkLibrary(this_02,this_01,lib_00,GENERAL_LibraryType);
          }
          linkLineComputer._vptr_cmLinkLineComputer =
               (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&linkLineComputer,"CMAKE_BUILD_TYPE","");
          psVar6 = cmMakefile::GetSafeDefinition(this_01,(string *)&linkLineComputer);
          buildType._M_dataplus._M_p = (pointer)&buildType.field_2;
          pcVar1 = (psVar6->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&buildType,pcVar1,pcVar1 + psVar6->_M_string_length);
          if (linkLineComputer._vptr_cmLinkLineComputer !=
              (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
            operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                            linkLineComputer.StateDir.DirectoryState.Position + 1);
          }
          cmsys::SystemTools::UpperCase((string *)&linkLineComputer,&buildType);
          std::__cxx11::string::operator=((string *)&buildType,(string *)&linkLineComputer);
          if (linkLineComputer._vptr_cmLinkLineComputer !=
              (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
            operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                            linkLineComputer.StateDir.DirectoryState.Position + 1);
          }
          linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
          linkLibs._M_string_length = 0;
          linkLibs.field_2._M_allocated_capacity =
               linkLibs.field_2._M_allocated_capacity & 0xffffffffffffff00;
          frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
          frameworkPath._M_string_length = 0;
          frameworkPath.field_2._M_local_buf[0] = '\0';
          linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
          linkPath._M_string_length = 0;
          linkPath.field_2._M_local_buf[0] = '\0';
          flags._M_string_length = 0;
          flags.field_2._M_local_buf[0] = '\0';
          linkFlags._M_string_length = 0;
          linkFlags.field_2._M_local_buf[0] = '\0';
          linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
          flags._M_dataplus._M_p = (pointer)&flags.field_2;
          cmGlobalGenerator::CreateGenerationObjects(this_00,AllTargets);
          this_03 = cmGlobalGenerator::FindGeneratorTarget(this_00,&this_02->Name);
          pcVar7 = cmGeneratorTarget::GetLocalGenerator(this_03);
          outputConverter = &pcVar7->super_cmOutputConverter;
          if (pcVar7 == (cmLocalGenerator *)0x0) {
            outputConverter = (cmOutputConverter *)0x0;
          }
          cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_108,pcVar7);
          cmStateSnapshot::GetDirectory((cmStateDirectory *)&system,(cmStateSnapshot *)local_108);
          cmLinkLineComputer::cmLinkLineComputer
                    (&linkLineComputer,outputConverter,(cmStateDirectory *)&system);
          cmLocalGenerator::GetTargetFlags
                    (pcVar7,&linkLineComputer,&buildType,&linkLibs,&flags,&linkFlags,&frameworkPath,
                     &linkPath,this_03);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&frameworkPath,&linkPath);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     (local_108,(ulong)linkLibs._M_dataplus._M_p);
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 == paVar9) {
            local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_220._8_8_ = plVar8[3];
            _system = (pointer)&local_220;
          }
          else {
            local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
            _system = (pointer)*plVar8;
          }
          local_228 = plVar8[1];
          *plVar8 = (long)paVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::operator=((string *)&linkLibs,(string *)&system);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_system != &local_220) {
            operator_delete(_system,local_220._M_allocated_capacity + 1);
          }
          if ((cmState *)local_108._0_8_ != (cmState *)(local_108 + 0x10)) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
          puts(linkLibs._M_dataplus._M_p);
          cmLinkLineComputer::~cmLinkLineComputer(&linkLineComputer);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
            operator_delete(linkFlags._M_dataplus._M_p,
                            CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                     linkFlags.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)flags._M_dataplus._M_p != &flags.field_2) {
            operator_delete(flags._M_dataplus._M_p,
                            CONCAT71(flags.field_2._M_allocated_capacity._1_7_,
                                     flags.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
            operator_delete(linkPath._M_dataplus._M_p,
                            CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                     linkPath.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
            operator_delete(frameworkPath._M_dataplus._M_p,
                            CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                                     frameworkPath.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
            operator_delete(linkLibs._M_dataplus._M_p,linkLibs.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)buildType._M_dataplus._M_p != &buildType.field_2) {
            operator_delete(buildType._M_dataplus._M_p,buildType.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&libList);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libs._M_dataplus._M_p != &libs.field_2) {
            operator_delete(libs._M_dataplus._M_p,libs.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&srcs);
        }
      }
      goto LAB_00216ae5;
    }
    if (bVar4) goto LAB_00216ae5;
    __format = "%s found.\n";
  }
  else {
    if (bVar4) goto LAB_00216ae5;
    __format = "%s not found.\n";
  }
  printf(__format,packageName._M_dataplus._M_p);
LAB_00216ae5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)packageName._M_dataplus._M_p != &packageName.field_2) {
    operator_delete(packageName._M_dataplus._M_p,packageName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mode._M_dataplus._M_p != &mode.field_2) {
    operator_delete(mode._M_dataplus._M_p,mode.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)language._M_dataplus._M_p != &language.field_2) {
    operator_delete(language._M_dataplus._M_p,language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)systemFile._M_dataplus._M_p != &systemFile.field_2) {
    operator_delete(systemFile._M_dataplus._M_p,systemFile.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = new cmGlobalGenerator(this);
  this->SetGlobalGenerator(gg);

  cmStateSnapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(
    cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource(
    cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  cmMakefile* mf = new cmMakefile(gg, snapshot);
  gg->AddMakefile(mf);

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile);

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound) {
    if (!quiet) {
      printf("%s not found.\n", packageName.c_str());
    }
  } else if (mode == "EXIST") {
    if (!quiet) {
      printf("%s found.\n", packageName.c_str());
    }
  } else if (mode == "COMPILE") {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs;
    cmSystemTools::ExpandListArgument(includes, includeDirs);

    gg->CreateGenerationObjects();
    cmLocalGenerator* lg = gg->LocalGenerators[0];
    std::string includeFlags =
      lg->GetIncludeFlags(includeDirs, nullptr, language);

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
  } else if (mode == "LINK") {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language.c_str());

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList;
    cmSystemTools::ExpandListArgument(libs, libList);
    for (std::string const& lib : libList) {
      tgt->AddLinkLibrary(*mf, lib, GENERAL_LibraryType);
    }

    std::string buildType = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
    buildType = cmSystemTools::UpperCase(buildType);

    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    gg->CreateGenerationObjects();
    cmGeneratorTarget* gtgt = gg->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, buildType, linkLibs, flags,
                       linkFlags, frameworkPath, linkPath, gtgt);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str());

    /*    if ( use_win32 )
          {
          tgt->SetProperty("WIN32_EXECUTABLE", "ON");
          }
        if ( use_macbundle)
          {
          tgt->SetProperty("MACOSX_BUNDLE", "ON");
          }*/
  }

  // free generic one if generated
  //  this->SetGlobalGenerator(0); // setting 0-pointer is not possible
  //  delete gg; // this crashes inside the cmake instance

  return packageFound;
}